

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_RenderingVenue.cpp
# Opt level: O0

char * __thiscall soul::RenderingVenue::Pimpl::renderActiveSessions(Pimpl *this,uint32_t numFrames)

{
  bool bVar1;
  reference ppSVar2;
  SessionImpl **s;
  iterator __end2;
  iterator __begin2;
  vector<soul::RenderingVenue::Pimpl::SessionImpl_*,_std::allocator<soul::RenderingVenue::Pimpl::SessionImpl_*>_>
  *__range2;
  lock_guard<std::mutex> local_28;
  lock_guard<std::mutex> l;
  uint32_t numFrames_local;
  Pimpl *this_local;
  
  l._M_device._4_4_ = numFrames;
  CPULoadMeasurer::startMeasurement(&this->loadMeasurer);
  std::lock_guard<std::mutex>::lock_guard(&local_28,&this->sessionListLock);
  if (l._M_device._4_4_ == 0) {
    this_local = (Pimpl *)anon_var_dwarf_dd992;
    bVar1 = true;
  }
  else {
    __end2 = std::
             vector<soul::RenderingVenue::Pimpl::SessionImpl_*,_std::allocator<soul::RenderingVenue::Pimpl::SessionImpl_*>_>
             ::begin(&this->activeSessions);
    s = (SessionImpl **)
        std::
        vector<soul::RenderingVenue::Pimpl::SessionImpl_*,_std::allocator<soul::RenderingVenue::Pimpl::SessionImpl_*>_>
        ::end(&this->activeSessions);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<soul::RenderingVenue::Pimpl::SessionImpl_**,_std::vector<soul::RenderingVenue::Pimpl::SessionImpl_*,_std::allocator<soul::RenderingVenue::Pimpl::SessionImpl_*>_>_>
                                       *)&s), bVar1) {
      ppSVar2 = __gnu_cxx::
                __normal_iterator<soul::RenderingVenue::Pimpl::SessionImpl_**,_std::vector<soul::RenderingVenue::Pimpl::SessionImpl_*,_std::allocator<soul::RenderingVenue::Pimpl::SessionImpl_*>_>_>
                ::operator*(&__end2);
      SessionImpl::render(*ppSVar2,l._M_device._4_4_);
      __gnu_cxx::
      __normal_iterator<soul::RenderingVenue::Pimpl::SessionImpl_**,_std::vector<soul::RenderingVenue::Pimpl::SessionImpl_*,_std::allocator<soul::RenderingVenue::Pimpl::SessionImpl_*>_>_>
      ::operator++(&__end2);
    }
    bVar1 = false;
  }
  std::lock_guard<std::mutex>::~lock_guard(&local_28);
  if (!bVar1) {
    CPULoadMeasurer::stopMeasurement(&this->loadMeasurer);
    this_local = (Pimpl *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char* renderActiveSessions (uint32_t numFrames)
    {
        loadMeasurer.startMeasurement();

        {
            std::lock_guard<std::mutex> l (sessionListLock);

            if (numFrames == 0)
                return "Illegal frame count";

            for (auto& s : activeSessions)
                s->render (numFrames);
        }

        loadMeasurer.stopMeasurement();
        return {};
    }